

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFtpCommand.cpp
# Opt level: O2

int __thiscall CUSERCommand::doWhat(CUSERCommand *this,CClient *pClient)

{
  bool bVar1;
  __type _Var2;
  ArrayIndex AVar3;
  Value *pVVar4;
  ostream *poVar5;
  uint index;
  Value value;
  Value user;
  string name;
  string ret;
  
  if ((this->super_CCommand).m_Args._M_string_length != 0) {
    Json::Value::Value(&value,nullValue);
    Json::Reader::Reader((Reader *)&ret);
    CCommand::GetUserInfo_abi_cxx11_();
    bVar1 = Json::Reader::parse((Reader *)&ret,
                                &CCommand::GetUserInfo[abi:cxx11]()::userInfo_abi_cxx11_,&value,true
                               );
    if (!bVar1) {
      poVar5 = std::operator<<((ostream *)&std::cout,"Load user info error,now exit.");
      std::endl<char,std::char_traits<char>>(poVar5);
      exit(-1);
    }
    pVVar4 = Json::Value::operator[](&value,"user");
    Json::Value::Value(&user,pVVar4);
    index = 0;
    while( true ) {
      AVar3 = Json::Value::size(&user);
      if (AVar3 <= index) break;
      pVVar4 = Json::Value::operator[](&user,index);
      pVVar4 = Json::Value::operator[](pVVar4,"name");
      Json::Value::asString_abi_cxx11_(&name,pVVar4);
      _Var2 = std::operator==(&name,&(this->super_CCommand).m_Args);
      if (_Var2) {
        CClient::SetClientName(pClient,&name);
      }
      std::__cxx11::string::~string((string *)&name);
      index = index + 1;
    }
    Json::Value::~Value(&user);
    Json::Reader::~Reader((Reader *)&ret);
    Json::Value::~Value(&value);
  }
  std::__cxx11::string::string
            ((string *)&ret,"331 Please specify the password.\r\n",(allocator *)&value);
  CClient::sendMsg(pClient,&ret);
  CClient::SetClientState(pClient,USER);
  std::__cxx11::string::~string((string *)&ret);
  return 1;
}

Assistant:

int CUSERCommand::doWhat(CClient *pClient) {
    if(!m_Args.empty()){
        Json::Value value;
        Json::Reader reader;
        if(reader.parse(CCommand::GetUserInfo(),value)){
            Json::Value user = value["user"];
            for(int i = 0;i < user.size();i++){
                string name = user[i]["name"].asString();
                if(name == m_Args){
                    pClient->SetClientName(name);
                }
            }
        }
        else{
            cout << "Load user info error,now exit." << endl;
            exit(-1);
        }
    }
    string ret = "331 Please specify the password.\r\n";
    pClient->sendMsg(ret);
    pClient->SetClientState(USER);
    return 1;
}